

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glwInitFunctions.cpp
# Opt level: O1

void glw::initExtensionsES(Functions *gl,FunctionLoader *loader,int numExtensions,char **extensions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  const_iterator cVar3;
  undefined8 uVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extSet;
  key_type local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<char_const*const*>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_58,extensions,extensions + numExtensions);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_KHR_blend_equation_advanced","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  p_Var2 = &local_58._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBlendBarrierKHR");
    *(undefined8 *)(gl + 0xf0) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_KHR_debug","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDebugMessageCallbackKHR");
    *(undefined8 *)(gl + 0x420) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDebugMessageControlKHR");
    *(undefined8 *)(gl + 0x428) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDebugMessageInsertKHR");
    *(undefined8 *)(gl + 0x430) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetDebugMessageLogKHR");
    *(undefined8 *)(gl + 0x7e0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetObjectLabelKHR");
    *(undefined8 *)(gl + 0x958) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetObjectPtrLabelKHR");
    *(undefined8 *)(gl + 0x960) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetPointervKHR");
    *(undefined8 *)(gl + 0x978) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glObjectLabelKHR");
    *(undefined8 *)(gl + 0xfc0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glObjectPtrLabelKHR");
    *(undefined8 *)(gl + 0xfc8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPopDebugGroupKHR");
    *(undefined8 *)(gl + 0x1030) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPushDebugGroupKHR");
    *(undefined8 *)(gl + 0x1200) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_KHR_robustness","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetGraphicsResetStatusKHR");
    *(undefined8 *)(gl + 0x840) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetnUniformfvKHR");
    *(undefined8 *)(gl + 0xc00) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetnUniformivKHR");
    *(undefined8 *)(gl + 0xc08) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetnUniformuivKHR");
    *(undefined8 *)(gl + 0xc10) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glReadnPixelsKHR");
    *(undefined8 *)(gl + 0x1228) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_EXT_tessellation_shader","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPatchParameteriEXT");
    *(undefined8 *)(gl + 0xfd8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_geometry_shader","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTextureEXT");
    *(undefined8 *)(gl + 0x690) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_robustness","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetGraphicsResetStatusEXT");
    *(undefined8 *)(gl + 0x840) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetnUniformfvEXT");
    *(undefined8 *)(gl + 0xc00) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetnUniformivEXT");
    *(undefined8 *)(gl + 0xc08) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glReadnPixelsEXT");
    *(undefined8 *)(gl + 0x1228) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_texture_buffer","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexBufferEXT");
    *(undefined8 *)(gl + 0x12f8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexBufferRangeEXT");
    *(undefined8 *)(gl + 0x1300) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_EXT_primitive_bounding_box","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPrimitiveBoundingBoxEXT");
    *(undefined8 *)(gl + 0x1040) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_copy_image","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glCopyImageSubDataEXT");
    *(undefined8 *)(gl + 0x310) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_EXT_draw_buffers_indexed","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquationSeparateiEXT");
    *(undefined8 *)(gl + 0x110) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquationiEXT");
    *(undefined8 *)(gl + 0x118) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFuncSeparateiEXT");
    *(undefined8 *)(gl + 0x130) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFunciEXT");
    *(undefined8 *)(gl + 0x138) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glColorMaskiEXT");
    *(undefined8 *)(gl + 0x240) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDisableiEXT");
    *(undefined8 *)(gl + 0x520) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glEnableiEXT");
    *(undefined8 *)(gl + 0x618) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glIsEnablediEXT");
    *(undefined8 *)(gl + 0xc80) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_EXT_draw_elements_base_vertex","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElementsBaseVertexEXT");
    *(undefined8 *)(gl + 0x570) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElementsInstancedBaseVertexEXT");
    *(undefined8 *)(gl + 0x590) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDrawRangeElementsBaseVertexEXT");
    *(undefined8 *)(gl + 0x5a8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glMultiDrawElementsBaseVertexEXT");
    *(undefined8 *)(gl + 0xde8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_texture_storage","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage1DEXT");
    *(undefined8 *)(gl + 0x1378) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage2DEXT");
    *(undefined8 *)(gl + 5000) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage3DEXT");
    *(undefined8 *)(gl + 0x13a0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTextureStorage1DEXT");
    *(undefined8 *)(gl + 0x1448) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTextureStorage2DEXT");
    *(undefined8 *)(gl + 0x1458) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTextureStorage3DEXT");
    *(undefined8 *)(gl + 0x1470) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_EXT_texture_border_clamp","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetSamplerParameterIivEXT");
    *(undefined8 *)(gl + 0xa38) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetSamplerParameterIuivEXT");
    *(undefined8 *)(gl + 0xa40) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterIivEXT");
    *(undefined8 *)(gl + 0xab8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterIuivEXT");
    *(undefined8 *)(gl + 0xac0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameterIivEXT");
    *(undefined8 *)(gl + 0x1260) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glSamplerParameterIuivEXT");
    *(undefined8 *)(gl + 0x1268) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterIivEXT");
    *(undefined8 *)(gl + 0x1340) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterIuivEXT");
    *(undefined8 *)(gl + 0x1348) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_EXT_debug_marker","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glInsertEventMarkerEXT");
    *(undefined8 *)(gl + 0xc20) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPopGroupMarkerEXT");
    *(undefined8 *)(gl + 0x1038) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glPushGroupMarkerEXT");
    *(undefined8 *)(gl + 0x1208) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_OES_EGL_image","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glEGLImageTargetRenderbufferStorageOES");
    *(undefined8 *)(gl + 0x5d0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glEGLImageTargetTexture2DOES");
    *(undefined8 *)(gl + 0x5d8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_OES_texture_3D","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage3DOES");
    *(undefined8 *)(gl + 0x298) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage3DOES");
    *(undefined8 *)(gl + 0x2b8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage3DOES");
    *(undefined8 *)(gl + 0x370) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTexture3DOES");
    *(undefined8 *)(gl + 0x6b0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage3DOES");
    *(undefined8 *)(gl + 0x1330) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage3DOES");
    *(undefined8 *)(gl + 0x13c8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_OES_texture_storage_multisample_2d_array","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glTexStorage3DMultisampleOES");
    *(undefined8 *)(gl + 0x13a8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_OES_sample_shading","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glMinSampleShadingOES");
    *(undefined8 *)(gl + 0xdc8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_OES_mapbuffer","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferPointervOES");
    *(undefined8 *)(gl + 0x7b0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glMapBufferOES");
    *(undefined8 *)(gl + 0xcf8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glUnmapBufferOES");
    *(undefined8 *)(gl + 0x1670) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_OES_vertex_array_object","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glBindVertexArrayOES");
    *(undefined8 *)(gl + 0xd8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteVertexArraysOES");
    *(undefined8 *)(gl + 0x490) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGenVertexArraysOES");
    *(undefined8 *)(gl + 0x708) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glIsVertexArrayOES");
    *(undefined8 *)(gl + 0xcd8) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"GL_OES_viewport_array","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDepthRangeArrayfvOES");
    *(undefined8 *)(gl + 0x4b8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDepthRangeIndexedfOES");
    *(undefined8 *)(gl + 0x4d0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glDisableiOES");
    *(undefined8 *)(gl + 0x520) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glEnableiOES");
    *(undefined8 *)(gl + 0x618) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetFloati_vOES");
    *(undefined8 *)(gl + 0x810) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glIsEnablediOES");
    *(undefined8 *)(gl + 0xc80) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glScissorArrayvOES");
    *(undefined8 *)(gl + 0x1298) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glScissorIndexedOES");
    *(undefined8 *)(gl + 0x12a0) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glScissorIndexedvOES");
    *(undefined8 *)(gl + 0x12a8) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glViewportArrayvOES");
    *(undefined8 *)(gl + 0x1a08) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glViewportIndexedfOES");
    *(undefined8 *)(gl + 0x1a10) = uVar4;
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glViewportIndexedfvOES");
    *(undefined8 *)(gl + 0x1a18) = uVar4;
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_NV_internalformat_sample_query","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var2) {
    uVar4 = (*(code *)**(undefined8 **)loader)(loader,"glGetInternalformatSampleivNV");
    *(undefined8 *)(gl + 0x870) = uVar4;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void initExtensionsES (Functions* gl, const FunctionLoader* loader, int numExtensions, const char* const* extensions)
{
	using std::string;
	using std::set;

	const set<string> extSet(extensions, extensions+numExtensions);

#include "glwInitExtES.inl"

}